

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O0

int blake2b_init_key(blake2b_state *S,uint8_t outlen,void *key,uint8_t keylen)

{
  int iVar1;
  byte in_CL;
  void *in_RDX;
  byte in_SIL;
  uint8_t block [128];
  blake2b_param P [1];
  undefined1 auStackY_e8 [8];
  uint64_t in_stack_ffffffffffffff20;
  blake2b_param *in_stack_ffffffffffffff28;
  blake2b_state *in_stack_ffffffffffffff30;
  undefined1 auStack_64 [4];
  undefined1 auStack_60 [8];
  undefined1 local_58;
  undefined1 local_57;
  undefined1 auStack_56 [14];
  undefined1 auStack_48 [16];
  undefined1 auStack_38 [23];
  byte local_21;
  void *local_20;
  int local_4;
  
  if ((in_SIL == 0) || (0x40 < in_SIL)) {
    local_4 = -1;
  }
  else if ((in_RDX == (void *)0x0) || ((in_CL == 0 || (0x40 < in_CL)))) {
    local_4 = -1;
  }
  else {
    local_21 = in_CL;
    local_20 = in_RDX;
    store32(auStack_64,0);
    store64(auStack_60,0);
    local_58 = 0;
    local_57 = 0;
    memset(auStack_56,0,0xe);
    memset(auStack_48,0,0x10);
    memset(auStack_38,0,0x10);
    iVar1 = blake2b_init_param(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      memset(auStackY_e8,0,0x80);
      memcpy(auStackY_e8,local_20,(ulong)local_21);
      blake2b_update(in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->digest_length,
                     in_stack_ffffffffffffff20);
      secure_zero_memory(auStackY_e8,0x80);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int blake2b_init_key( blake2b_state *S, const uint8_t outlen, const void *key, const uint8_t keylen )
{
  blake2b_param P[1];

  if ( ( !outlen ) || ( outlen > BLAKE2B_OUTBYTES ) ) return -1;

  if ( !key || !keylen || keylen > BLAKE2B_KEYBYTES ) return -1;

  P->digest_length = outlen;
  P->key_length    = keylen;
  P->fanout        = 1;
  P->depth         = 1;
  store32( &P->leaf_length, 0 );
  store64( &P->node_offset, 0 );
  P->node_depth    = 0;
  P->inner_length  = 0;
  memset( P->reserved, 0, sizeof( P->reserved ) );
  memset( P->salt,     0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );

  if( blake2b_init_param( S, P ) < 0 ) return -1;

  {
    uint8_t block[BLAKE2B_BLOCKBYTES];
    memset( block, 0, BLAKE2B_BLOCKBYTES );
    memcpy( block, key, keylen );
    blake2b_update( S, block, BLAKE2B_BLOCKBYTES );
    secure_zero_memory( block, BLAKE2B_BLOCKBYTES ); /* Burn the key from stack */
  }
  return 0;
}